

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_DDictHashSet_emplaceDDict(ZSTD_DDictHashSet *hashSet,ZSTD_DDict *ddict)

{
  size_t sVar1;
  uint dictID_00;
  uint uVar2;
  size_t idxRangeMask;
  size_t idx;
  U32 dictID;
  ZSTD_DDict *ddict_local;
  ZSTD_DDictHashSet *hashSet_local;
  
  dictID_00 = ZSTD_getDictID_fromDDict(ddict);
  idxRangeMask = ZSTD_DDictHashSet_getIndex(hashSet,dictID_00);
  sVar1 = hashSet->ddictPtrTableSize;
  if (hashSet->ddictPtrCount == hashSet->ddictPtrTableSize) {
    hashSet_local = (ZSTD_DDictHashSet *)0xffffffffffffffff;
  }
  else {
    for (; hashSet->ddictPtrTable[idxRangeMask] != (ZSTD_DDict *)0x0;
        idxRangeMask = (sVar1 - 1 & idxRangeMask) + 1) {
      uVar2 = ZSTD_getDictID_fromDDict(hashSet->ddictPtrTable[idxRangeMask]);
      if (uVar2 == dictID_00) {
        hashSet->ddictPtrTable[idxRangeMask] = ddict;
        return 0;
      }
    }
    hashSet->ddictPtrTable[idxRangeMask] = ddict;
    hashSet->ddictPtrCount = hashSet->ddictPtrCount + 1;
    hashSet_local = (ZSTD_DDictHashSet *)0x0;
  }
  return (size_t)hashSet_local;
}

Assistant:

static size_t ZSTD_DDictHashSet_emplaceDDict(ZSTD_DDictHashSet* hashSet, const ZSTD_DDict* ddict) {
    const U32 dictID = ZSTD_getDictID_fromDDict(ddict);
    size_t idx = ZSTD_DDictHashSet_getIndex(hashSet, dictID);
    const size_t idxRangeMask = hashSet->ddictPtrTableSize - 1;
    RETURN_ERROR_IF(hashSet->ddictPtrCount == hashSet->ddictPtrTableSize, GENERIC, "Hash set is full!");
    DEBUGLOG(4, "Hashed index: for dictID: %u is %zu", dictID, idx);
    while (hashSet->ddictPtrTable[idx] != NULL) {
        /* Replace existing ddict if inserting ddict with same dictID */
        if (ZSTD_getDictID_fromDDict(hashSet->ddictPtrTable[idx]) == dictID) {
            DEBUGLOG(4, "DictID already exists, replacing rather than adding");
            hashSet->ddictPtrTable[idx] = ddict;
            return 0;
        }
        idx &= idxRangeMask;
        idx++;
    }
    DEBUGLOG(4, "Final idx after probing for dictID %u is: %zu", dictID, idx);
    hashSet->ddictPtrTable[idx] = ddict;
    hashSet->ddictPtrCount++;
    return 0;
}